

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::ElementsAreMatcherImpl<const_std::array<unsigned_char,_5UL>_&>::MatchAndExplain
          (ElementsAreMatcherImpl<const_std::array<unsigned_char,_5UL>_&> *this,
          array<unsigned_char,_5UL> *container,MatchResultListener *listener)

{
  ostream *poVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  pointer pMVar5;
  MatchResultListener *pMVar6;
  pointer pMVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  StringMatchResultListener s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  long *local_1e8 [2];
  long local_1d8 [2];
  undefined1 local_1c8 [32];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_200,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)local_1c8);
  lVar8 = 0;
  lVar10 = 0;
  lVar11 = 0;
  do {
    pMVar5 = (this->matchers_).
             super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar9 = ((long)(this->matchers_).
                   super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 3) *
            -0x5555555555555555;
    if (lVar11 == lVar9) {
LAB_0013767e:
      pMVar5 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar7 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((long)pMVar7 - (long)pMVar5 != 0x78) goto LAB_00137772;
      if (lVar11 == lVar9) goto LAB_001376a4;
      if (poVar1 == (ostream *)0x0) goto LAB_00137856;
      pMVar6 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      if (pMVar6->stream_ != (ostream *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)pMVar6->stream_);
      }
      MatchResultListener::operator<<(pMVar6,(char (*) [15])" doesn\'t match");
      poVar1 = listener->stream_;
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((local_200.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar10));
      bVar3 = false;
      if ((poVar1 == (ostream *)0x0) || (bVar3 = false, iVar4 == 0)) goto LAB_00137859;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,*(char **)((long)&((local_200.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar10),
                 *(long *)((long)&(local_200.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                          lVar10));
      goto LAB_00137856;
    }
    if (poVar1 == (ostream *)0x0) {
      local_1c8._8_8_ = (ostream *)0x0;
      local_1c8._0_8_ = &PTR__MatchResultListener_00197638;
      bVar3 = MatcherBase<const_unsigned_char_&>::MatchAndExplain
                        ((MatcherBase<const_unsigned_char_&> *)
                         ((long)&(pMVar5->super_MatcherBase<const_unsigned_char_&>).
                                 super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                         lVar8),container->_M_elems + lVar11,(MatchResultListener *)local_1c8);
    }
    else {
      local_1c8._8_8_ = local_1a8;
      local_1c8._0_8_ = &PTR__StringMatchResultListener_00197740;
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x10));
      bVar3 = MatcherBase<const_unsigned_char_&>::MatchAndExplain
                        ((MatcherBase<const_unsigned_char_&> *)
                         ((long)&(((this->matchers_).
                                   super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_MatcherBase<const_unsigned_char_&>).
                                 super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                         lVar8),container->_M_elems + lVar11,(MatchResultListener *)local_1c8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&((local_200.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar10),
                 (string *)local_1e8);
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0],local_1d8[0] + 1);
      }
      local_1c8._0_8_ = &PTR__StringMatchResultListener_00197740;
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x10));
      std::ios_base::~ios_base(local_138);
    }
    if (!bVar3) goto LAB_0013767e;
    lVar11 = lVar11 + 1;
    lVar10 = lVar10 + 0x20;
    lVar8 = lVar8 + 0x18;
  } while (lVar11 != 5);
  pMVar5 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar7 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pMVar7 - (long)pMVar5 == 0x78) {
LAB_001376a4:
    bVar3 = true;
    if ((poVar1 != (ostream *)0x0) && (pMVar7 != pMVar5)) {
      lVar8 = 8;
      bVar3 = false;
      lVar10 = 0;
      do {
        pbVar2 = local_200.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(long *)((long)&((local_200.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8
                     ) != 0) {
          if (bVar3) {
            MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
          }
          pMVar6 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
          if (pMVar6->stream_ != (ostream *)0x0) {
            std::ostream::_M_insert<unsigned_long>((ulong)pMVar6->stream_);
          }
          pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [11])" matches, ");
          bVar3 = true;
          if (pMVar6->stream_ != (ostream *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (pMVar6->stream_,*(char **)((long)pbVar2 + lVar8 + -8),
                       *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar8));
          }
        }
        lVar10 = lVar10 + 1;
        lVar8 = lVar8 + 0x20;
      } while (lVar10 != ((long)(this->matchers_).
                                super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->matchers_).
                                super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555);
      bVar3 = true;
    }
  }
  else {
LAB_00137772:
    if (poVar1 != (ostream *)0x0) {
      pMVar6 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
      Elements((ElementsAreMatcherImpl<const_std::array<unsigned_char,_5UL>_&> *)local_1c8,5);
      MatchResultListener::operator<<(pMVar6,(Message *)local_1c8);
      if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_1c8._0_8_ !=
          (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(_func_int **)local_1c8._0_8_ + 8))();
      }
    }
LAB_00137856:
    bVar3 = false;
  }
LAB_00137859:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  return bVar3;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    typename StlContainer::const_iterator it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }